

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,ImageClearingTestInstance *this,string *successMessage
          ,UVec4 *clearCoords)

{
  TextureFormat *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool *pbVar3;
  char *pcVar4;
  float fVar5;
  undefined4 uVar6;
  ConstPixelBufferAccess *this_00;
  undefined4 uVar9;
  pointer pPVar7;
  pointer pcVar8;
  ChannelOrder CVar10;
  bool bVar11;
  int i;
  TextureChannelClass TVar12;
  int iVar13;
  TextureFormat TVar14;
  TestParams_conflict *pTVar15;
  ulong uVar16;
  ostream *poVar17;
  TestStatus *extraout_RAX;
  TestStatus *extraout_RAX_00;
  TestStatus *extraout_RAX_01;
  TestStatus *extraout_RAX_02;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  TextureFormat *pTVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  uint uVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  BVec4 channelMask;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image;
  string message;
  TextureFormat format;
  IVec4 mantissaBits;
  Vec4 threshold;
  TextureFormat format_1;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image_2;
  stringstream s;
  uint local_2f8;
  Vector<bool,_4> local_2f4;
  int local_2f0;
  float local_2ec;
  undefined1 local_2e8 [32];
  ios_base *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string *local_2a0;
  long *local_298 [2];
  long local_288 [2];
  undefined1 local_278 [12];
  float fStack_26c;
  TestStatus *local_260;
  TextureFormat local_258;
  TextureFormat TStack_250;
  long local_240;
  Vector<float,_4> local_238;
  undefined4 uStack_228;
  undefined4 uStack_224;
  TextureFormat local_220;
  uint local_218;
  int local_214;
  ulong local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  string *local_200;
  ulong local_1f8;
  long local_1f0;
  UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> local_1e8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [7];
  ios_base local_158 [272];
  Vector<float,_4> local_48;
  
  local_1d8 = (undefined1  [16])0x0;
  local_2ec = (float)CONCAT31(local_2ec._1_3_,1);
  if (clearCoords->m_data[0] == 0) {
    uVar16 = 0;
    do {
      uVar20 = uVar16;
      if (uVar20 == 3) break;
      uVar16 = uVar20 + 1;
    } while (clearCoords->m_data[uVar20 + 1] == *(uint *)(local_1d8 + uVar20 * 4 + 4));
    local_2ec = (float)CONCAT31(local_2ec._1_3_,uVar20 < 3);
  }
  local_260 = __return_storage_ptr__;
  TVar14 = ::vk::mapVkFormat(this->m_params->imageFormat);
  local_2e8._24_8_ = this;
  if ((TVar14.order == DS) || (TVar14.order == D)) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              local_2e8,this,2);
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    local_2c0._M_string_length = 0;
    local_2c0.field_2._M_local_buf[0] = '\0';
    pTVar15 = this->m_params;
    if ((pTVar15->imageExtent).height != 0) {
      uVar23 = 0;
      local_2a0 = successMessage;
      do {
        if ((pTVar15->imageExtent).width != 0) {
          uVar22 = 0;
          do {
            lVar21 = 0x28;
            if ((local_2ec._0_1_ != '\0') &&
               (((uVar22 < clearCoords->m_data[0] &&
                 ((uVar23 < clearCoords->m_data[1] || (clearCoords->m_data[3] <= uVar23)))) ||
                ((clearCoords->m_data[2] <= uVar22 &&
                 ((uVar23 < clearCoords->m_data[1] || (clearCoords->m_data[3] <= uVar23)))))))) {
              lVar21 = 0x18;
            }
            fVar5 = *(float *)((long)pTVar15->clearValue + lVar21 + -0x28);
            this_00 = *(ConstPixelBufferAccess **)(CONCAT44(local_2e8._4_4_,local_2e8._0_4_) + 0x20)
            ;
            local_278._0_8_ =
                 tcu::getEffectiveDepthStencilTextureFormat(&this_00->m_format,MODE_DEPTH);
            TVar12 = tcu::getTextureChannelClass(SUB84(local_278._0_8_,4));
            if (TVar12 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
              tcu::getTextureFormatBitDepth((tcu *)local_1d8,(TextureFormat *)local_278);
              auVar32 = local_1d8;
              fVar26 = tcu::ConstPixelBufferAccess::getPixDepth(this_00,uVar22,uVar23,0);
              fVar36 = 2.0 / (float)~(-1 << (auVar32[0] & 0x1f));
              fVar35 = fVar26 - fVar5;
              uVar25 = -(uint)(-fVar35 <= fVar35);
              if (fVar36 < (float)(~uVar25 & (uint)-fVar35 | (uint)fVar35 & uVar25)) {
                local_2e8._24_4_ = fVar26;
                local_2ec = fVar36;
                std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8[0]._M_local_buf,"Ref:",4);
                poVar17 = std::ostream::_M_insert<double>((double)fVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                poVar17 = std::ostream::_M_insert<double>((double)local_2ec);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17," Depth:",7);
                std::ostream::_M_insert<double>((double)(float)local_2e8._24_4_);
                std::__cxx11::stringbuf::str();
LAB_0047f07e:
                std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_298);
                if (local_298[0] != local_288) {
                  operator_delete(local_298[0],local_288[0] + 1);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
                std::ios_base::~ios_base(local_158);
LAB_0047f0cb:
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1d8,"Depth value mismatch! ",&local_2c0);
                local_260->m_code = QP_TEST_RESULT_FAIL;
                (local_260->m_description)._M_dataplus._M_p =
                     (pointer)&(local_260->m_description).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_260->m_description,local_1d8._0_8_,
                           (pointer)(local_1d8._0_8_ + local_1d8._8_8_));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._0_8_ != local_1c8) {
                  operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                  operator_delete(local_2c0._M_dataplus._M_p,
                                  CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                           local_2c0.field_2._M_local_buf[0]) + 1);
                }
                de::details::
                UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                ::reset((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                         *)local_2e8);
                return extraout_RAX_00;
              }
            }
            else {
              if (TVar12 != TEXTURECHANNELCLASS_FLOATING_POINT) goto LAB_0047f0cb;
              fVar26 = tcu::ConstPixelBufferAccess::getPixDepth(this_00,uVar22,uVar23,0);
              local_240 = CONCAT44(local_240._4_4_,fVar26);
              tcu::getTextureFormatMantissaBitDepth((tcu *)local_1d8,(TextureFormat *)local_278);
              fVar26 = ABS((float)local_240);
              fVar35 = ABS(fVar5);
              iVar19 = (int)fVar26 - (int)fVar35;
              if ((uint)fVar26 < (uint)fVar35) {
                iVar19 = -((int)fVar26 - (int)fVar35);
              }
              fVar26 = (float)(10 << (0x17U - (char)local_1d8[0] & 0x1f));
              if ((int)fVar26 < iVar19) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8[0]._M_local_buf,"Ref:",4);
                poVar17 = std::ostream::_M_insert<double>((double)fVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                poVar17 = std::ostream::_M_insert<double>((double)fVar26);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17," Depth:",7);
                std::ostream::_M_insert<double>((double)(float)local_240);
                std::__cxx11::stringbuf::str();
                goto LAB_0047f07e;
              }
            }
            uVar22 = uVar22 + 1;
            pTVar15 = *(TestParams_conflict **)(local_2e8._24_8_ + 0x10);
          } while (uVar22 < (pTVar15->imageExtent).width);
        }
        successMessage = local_2a0;
        this = (ImageClearingTestInstance *)local_2e8._24_8_;
        uVar23 = uVar23 + 1;
      } while (uVar23 < (pTVar15->imageExtent).height);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                 local_2c0.field_2._M_local_buf[0]) + 1);
      }
    }
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::reset((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
            local_2e8);
  }
  TVar14 = ::vk::mapVkFormat(this->m_params->imageFormat);
  if (TVar14.order - S < 2) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              local_2e8,this,4);
    paVar2 = &local_2c0.field_2;
    local_2c0._M_string_length = 0;
    local_2c0.field_2._M_local_buf[0] = '\0';
    pTVar15 = this->m_params;
    local_2c0._M_dataplus._M_p = (pointer)paVar2;
    if ((pTVar15->imageExtent).height != 0) {
      uVar23 = 0;
      local_2a0 = successMessage;
      do {
        if ((pTVar15->imageExtent).width != 0) {
          uVar22 = 0;
          do {
            lVar21 = 0x2c;
            if ((local_2ec._0_1_ != '\0') &&
               (((uVar22 < clearCoords->m_data[0] &&
                 ((uVar23 < clearCoords->m_data[1] || (clearCoords->m_data[3] <= uVar23)))) ||
                ((clearCoords->m_data[2] <= uVar22 &&
                 ((uVar23 < clearCoords->m_data[1] || (clearCoords->m_data[3] <= uVar23)))))))) {
              lVar21 = 0x1c;
            }
            iVar19 = *(int *)((long)pTVar15->clearValue + lVar21 + -0x28);
            iVar13 = tcu::ConstPixelBufferAccess::getPixStencil
                               (*(ConstPixelBufferAccess **)
                                 (CONCAT44(local_2e8._4_4_,local_2e8._0_4_) + 0x20),uVar22,uVar23,0)
            ;
            if (iVar13 != iVar19) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8[0]._M_local_buf,"Ref:",4);
              poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:0",0xc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," Stencil:",9);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_298);
              if (local_298[0] != local_288) {
                operator_delete(local_298[0],local_288[0] + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
              std::ios_base::~ios_base(local_158);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d8,"Stencil value mismatch! ",&local_2c0);
              local_260->m_code = QP_TEST_RESULT_FAIL;
              (local_260->m_description)._M_dataplus._M_p =
                   (pointer)&(local_260->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_260->m_description,local_1d8._0_8_,
                         (pointer)(local_1d8._0_8_ + local_1d8._8_8_));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._0_8_ != local_1c8) {
                operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != paVar2) {
                operator_delete(local_2c0._M_dataplus._M_p,
                                CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                         local_2c0.field_2._M_local_buf[0]) + 1);
              }
              de::details::
              UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>::
              reset((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                     *)local_2e8);
              return extraout_RAX;
            }
            uVar22 = uVar22 + 1;
            pTVar15 = *(TestParams_conflict **)(local_2e8._24_8_ + 0x10);
            this = (ImageClearingTestInstance *)local_2e8._24_8_;
          } while (uVar22 < (pTVar15->imageExtent).width);
        }
        successMessage = local_2a0;
        uVar23 = uVar23 + 1;
      } while (uVar23 < (pTVar15->imageExtent).height);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                 local_2c0.field_2._M_local_buf[0]) + 1);
      }
    }
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::reset((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
            local_2e8);
  }
  bVar11 = ::vk::isDepthStencilFormat(this->m_params->imageFormat);
  if (!bVar11) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              &local_1e8,this,1);
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    local_2c0._M_string_length = 0;
    local_2c0.field_2._M_local_buf[0] = '\0';
    bVar11 = true;
    if (this->m_imageMipLevels != 0) {
      local_2c8 = local_158;
      local_200 = (string *)&local_260->m_description;
      local_208 = &(local_260->m_description).field_2;
      uVar23 = 0;
      local_2a0 = successMessage;
      do {
        pTVar15 = this->m_params;
        uVar6 = (pTVar15->imageExtent).width;
        uVar9 = (pTVar15->imageExtent).height;
        bVar18 = (byte)uVar23;
        uVar22 = (uint)uVar6 >> (bVar18 & 0x1f);
        local_1f8 = (ulong)(uVar22 + (uVar22 == 0));
        uVar22 = (uint)uVar9 >> (bVar18 & 0x1f);
        local_210 = (ulong)(uVar22 + (uVar22 == 0));
        uVar22 = (pTVar15->imageExtent).depth >> (bVar18 & 0x1f);
        local_214 = uVar22 + (uVar22 == 0);
        local_240 = (long)(int)uVar23;
        local_1f0 = (ulong)(this->m_thresholdMipLevel <= uVar23) << 4;
        local_2f0 = 0;
        local_218 = uVar23;
        do {
          local_2f8 = 0;
          do {
            uVar23 = 0;
            do {
              lVar21 = local_240;
              if ((local_2ec._0_1_ == '\0') ||
                 (((clearCoords->m_data[0] <= uVar23 ||
                   ((clearCoords->m_data[1] <= local_2f8 && (local_2f8 < clearCoords->m_data[3]))))
                  && ((uVar23 < clearCoords->m_data[2] ||
                      ((clearCoords->m_data[1] <= local_2f8 && (local_2f8 < clearCoords->m_data[3]))
                      )))))) {
                pTVar24 = (TextureFormat *)((long)this->m_params->clearValue + local_1f0);
              }
              else {
                pTVar24 = (TextureFormat *)&this->m_params->initValue;
              }
              pPVar7 = ((local_1e8.m_data.ptr)->m_access).
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_220 = *(TextureFormat *)(pPVar7 + local_240);
              TVar12 = tcu::getTextureChannelClass(local_220.type);
              tcu::getTextureFormatChannelMask((tcu *)&local_2f4,&local_220);
              if (TEXTURECHANNELCLASS_FLOATING_POINT < TVar12) {
LAB_0047f3e9:
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1d8,"Color value mismatch! ",&local_2c0);
                local_260->m_code = QP_TEST_RESULT_FAIL;
                (local_260->m_description)._M_dataplus._M_p = (pointer)local_208;
                std::__cxx11::string::_M_construct<char*>
                          (local_200,local_1d8._0_8_,(pointer)(local_1d8._0_8_ + local_1d8._8_8_));
                successMessage = local_2a0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._0_8_ != local_1c8) {
                  operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
                }
                bVar11 = false;
                goto LAB_0047f46d;
              }
              pTVar1 = (TextureFormat *)(pPVar7 + lVar21);
              iVar19 = (int)pTVar1;
              switch(TVar12) {
              default:
                tcu::getTextureFormatBitDepth((tcu *)local_2e8,&local_220);
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_278,iVar19,uVar23,local_2f8);
                local_258 = *pTVar24;
                TStack_250 = pTVar24[1];
                bVar11 = TVar12 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
                local_238.m_data[0] = 1.0;
                if (0 < (int)local_2e8._0_4_) {
                  local_238.m_data[0] =
                       1.0 / ((float)(1 << ((char)local_2e8._0_4_ - bVar11 & 0x1fU)) + -1.0);
                }
                local_238.m_data[1] = 1.0;
                if (0 < (int)local_2e8._4_4_) {
                  local_238.m_data[1] =
                       1.0 / ((float)(1 << ((char)local_2e8._4_4_ - bVar11 & 0x1fU)) + -1.0);
                }
                local_238.m_data[2] = 1.0;
                if (0 < (int)local_2e8._8_4_) {
                  local_238.m_data[2] =
                       1.0 / ((float)(1 << ((char)local_2e8._8_4_ - bVar11 & 0x1fU)) + -1.0);
                }
                local_238.m_data[3] = 1.0;
                if (0 < (int)local_2e8._12_4_) {
                  local_238.m_data[3] =
                       1.0 / ((float)(1 << ((char)local_2e8._12_4_ - bVar11 & 0x1fU)) + -1.0);
                }
                bVar11 = tcu::isSRGB(*pTVar1);
                if (bVar11) {
                  tcu::linearToSRGB((tcu *)local_1d8,(Vec4 *)&local_258);
                  auVar32 = local_1d8;
                  local_258.order = local_1d8._0_4_;
                  local_258.type = local_1d8._4_4_;
                  TStack_250.order = local_1d8._8_4_;
                  TStack_250.type = local_1d8._12_4_;
                  local_1d8 = auVar32;
                }
                auVar29._4_4_ =
                     -(uint)((float)(~-(uint)((float)local_258.type < (float)local_278._4_4_) &
                                     (uint)((float)local_258.type - (float)local_278._4_4_) |
                                    (uint)((float)local_278._4_4_ - (float)local_258.type) &
                                    -(uint)((float)local_258.type < (float)local_278._4_4_)) <=
                            local_238.m_data[1]);
                auVar29._0_4_ =
                     -(uint)((float)(~-(uint)((float)local_258.order < (float)local_278._0_4_) &
                                     (uint)((float)local_258.order - (float)local_278._0_4_) |
                                    (uint)((float)local_278._0_4_ - (float)local_258.order) &
                                    -(uint)((float)local_258.order < (float)local_278._0_4_)) <=
                            local_238.m_data[0]);
                auVar29._8_4_ =
                     -(uint)((float)(~-(uint)((float)TStack_250.order < (float)local_278._8_4_) &
                                     (uint)((float)TStack_250.order - (float)local_278._8_4_) |
                                    (uint)((float)local_278._8_4_ - (float)TStack_250.order) &
                                    -(uint)((float)TStack_250.order < (float)local_278._8_4_)) <=
                            local_238.m_data[2]);
                auVar29._12_4_ =
                     -(uint)((float)(~-(uint)((float)TStack_250.type < fStack_26c) &
                                     (uint)((float)TStack_250.type - fStack_26c) |
                                    (uint)(fStack_26c - (float)TStack_250.type) &
                                    -(uint)((float)TStack_250.type < fStack_26c)) <=
                            local_238.m_data[3]);
                auVar32 = packssdw(auVar29,auVar29);
                auVar32 = packsswb(auVar32,auVar32);
                local_1d8._0_4_ = (uint)local_2f4.m_data & auVar32._0_4_ & (uint)DAT_00ac4030;
                lVar21 = 0;
                bVar11 = false;
                do {
                  while (bVar11) {
                    lVar21 = lVar21 + 1;
                    bVar11 = true;
                    if (lVar21 == 4) goto LAB_0047f162;
                  }
                  pcVar4 = local_1d8 + lVar21;
                  pbVar3 = local_2f4.m_data + lVar21;
                  bVar11 = (bool)*pcVar4 != *pbVar3;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                this = (ImageClearingTestInstance *)local_2e8._24_8_;
                if ((bool)*pcVar4 != *pbVar3) {
LAB_0047f162:
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c8[0]._M_local_buf,"Ref:",4);
                  poVar17 = tcu::operator<<((ostream *)local_1c8[0]._M_local_buf,
                                            (Vector<float,_4> *)&local_258);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Mask:",6);
                  poVar17 = tcu::operator<<(poVar17,&local_2f4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                  poVar17 = tcu::operator<<(poVar17,&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Color:",7);
                  tcu::operator<<(poVar17,(Vector<float,_4> *)local_278);
                  std::__cxx11::stringbuf::str();
LAB_0047f39f:
                  std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_298);
                  if (local_298[0] != local_288) {
                    operator_delete(local_298[0],local_288[0] + 1);
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
                  std::ios_base::~ios_base(local_2c8);
                  goto LAB_0047f3e9;
                }
                break;
              case TEXTURECHANNELCLASS_SIGNED_INTEGER:
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_2e8,iVar19,uVar23,local_2f8);
                CVar10 = pTVar24[1].order;
                local_278._0_4_ = pTVar24->order;
                local_278._4_4_ = pTVar24->type;
                stack0xfffffffffffffd90 = pTVar24[1];
                local_258.order = A;
                local_258.type = SNORM_INT16;
                TStack_250.order = A;
                TStack_250.type = SNORM_INT16;
                uVar22 = -(uint)((int)pTVar24->order < (int)local_2e8._0_4_);
                uVar25 = -(uint)((int)pTVar24->type < (int)local_2e8._4_4_);
                uVar33 = -(uint)((int)CVar10 < (int)local_2e8._8_4_);
                uVar34 = -(uint)((int)pTVar24[1].type < (int)local_2e8._12_4_);
                auVar30._0_4_ =
                     -(uint)(1 < (int)(uVar22 - (local_2e8._0_4_ - pTVar24->order ^ uVar22)));
                auVar30._4_4_ =
                     -(uint)(1 < (int)(uVar25 - (local_2e8._4_4_ - pTVar24->type ^ uVar25)));
                auVar30._8_4_ = -(uint)(1 < (int)(uVar33 - (local_2e8._8_4_ - CVar10 ^ uVar33)));
                auVar30._12_4_ =
                     -(uint)(1 < (int)(uVar34 - (local_2e8._12_4_ - pTVar24[1].type ^ uVar34)));
                auVar32 = packssdw(auVar30,auVar30);
                auVar32 = packsswb(auVar32,auVar32);
                local_1d8._0_4_ = ~auVar32._0_4_ & (uint)local_2f4.m_data & (uint)DAT_00ac4030;
                lVar21 = 0;
                bVar11 = false;
                do {
                  while (bVar11) {
                    lVar21 = lVar21 + 1;
                    bVar11 = true;
                    if (lVar21 == 4) goto LAB_0047f2e5;
                  }
                  pcVar4 = local_1d8 + lVar21;
                  pbVar3 = local_2f4.m_data + lVar21;
                  bVar11 = (bool)*pcVar4 != *pbVar3;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                this = (ImageClearingTestInstance *)local_2e8._24_8_;
                if ((bool)*pcVar4 != *pbVar3) {
LAB_0047f2e5:
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c8[0]._M_local_buf,"Ref:",4);
                  poVar17 = tcu::operator<<((ostream *)local_1c8[0]._M_local_buf,
                                            (Vector<int,_4> *)local_278);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Mask:",6);
                  poVar17 = tcu::operator<<(poVar17,&local_2f4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                  poVar17 = tcu::operator<<(poVar17,(Vector<int,_4> *)&local_258);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Color:",7);
                  tcu::operator<<(poVar17,(Vector<int,_4> *)local_2e8);
                  std::__cxx11::stringbuf::str();
                  goto LAB_0047f39f;
                }
                break;
              case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_2e8,iVar19,uVar23,local_2f8);
                CVar10 = pTVar24[1].order;
                local_278._0_4_ = pTVar24->order;
                local_278._4_4_ = pTVar24->type;
                stack0xfffffffffffffd90 = pTVar24[1];
                local_258.order = A;
                local_258.type = SNORM_INT16;
                TStack_250.order = A;
                TStack_250.type = SNORM_INT16;
                uVar22 = -(uint)((int)(pTVar24->order ^ 0x80000000) < (int)-(float)local_2e8._0_4_);
                uVar25 = -(uint)((int)(pTVar24->type ^ 0x80000000) < (int)-(float)local_2e8._4_4_);
                uVar33 = -(uint)((int)(CVar10 ^ 0x80000000) < (int)-(float)local_2e8._8_4_);
                uVar34 = -(uint)((int)(pTVar24[1].type ^ 0x80000000) < (int)-(float)local_2e8._12_4_
                                );
                auVar31._0_4_ =
                     -(uint)(-0x7fffffff <
                            (int)(uVar22 - (local_2e8._0_4_ - pTVar24->order ^ uVar22) ^ 0x80000000)
                            );
                auVar31._4_4_ =
                     -(uint)(-0x7fffffff <
                            (int)(uVar25 - (local_2e8._4_4_ - pTVar24->type ^ uVar25) ^ 0x80000000))
                ;
                auVar31._8_4_ =
                     -(uint)(-0x7fffffff <
                            (int)(uVar33 - (local_2e8._8_4_ - CVar10 ^ uVar33) ^ 0x80000000));
                auVar31._12_4_ =
                     -(uint)(-0x7fffffff <
                            (int)(uVar34 - (local_2e8._12_4_ - pTVar24[1].type ^ uVar34) ^
                                 0x80000000));
                auVar32 = packssdw(auVar31,auVar31);
                auVar32 = packsswb(auVar32,auVar32);
                local_1d8._0_4_ = ~auVar32._0_4_ & (uint)local_2f4.m_data & (uint)DAT_00ac4030;
                lVar21 = 0;
                bVar11 = false;
                do {
                  while (bVar11) {
                    lVar21 = lVar21 + 1;
                    bVar11 = true;
                    if (lVar21 == 4) goto LAB_0047f226;
                  }
                  pcVar4 = local_1d8 + lVar21;
                  pbVar3 = local_2f4.m_data + lVar21;
                  bVar11 = (bool)*pcVar4 != *pbVar3;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                this = (ImageClearingTestInstance *)local_2e8._24_8_;
                if ((bool)*pcVar4 != *pbVar3) {
LAB_0047f226:
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c8[0]._M_local_buf,"Ref:",4);
                  poVar17 = tcu::operator<<((ostream *)local_1c8[0]._M_local_buf,
                                            (Vector<unsigned_int,_4> *)local_278);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Mask:",6);
                  poVar17 = tcu::operator<<(poVar17,&local_2f4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                  poVar17 = tcu::operator<<(poVar17,(Vector<unsigned_int,_4> *)&local_258);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Color:",7);
                  tcu::operator<<(poVar17,(Vector<unsigned_int,_4> *)local_2e8);
                  std::__cxx11::stringbuf::str();
                  goto LAB_0047f39f;
                }
                break;
              case TEXTURECHANNELCLASS_FLOATING_POINT:
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_2e8,iVar19,uVar23,local_2f8);
                local_278._0_8_ = *pTVar24;
                unique0x10000ff5 = pTVar24[1];
                tcu::getTextureFormatMantissaBitDepth((tcu *)&local_258,&local_220);
                auVar32._0_4_ = (int)(float)((0x17 - local_258.order) * 0x800000 + 0x3f800000);
                auVar32._4_4_ = (int)(float)((0x17 - local_258.type) * 0x800000 + 0x3f800000);
                auVar32._8_4_ = (int)(float)((0x17 - TStack_250.order) * 0x800000 + 0x3f800000);
                auVar32._12_4_ = (int)(float)((0x17 - TStack_250.type) * 0x800000 + 0x3f800000);
                auVar28._4_4_ = auVar32._4_4_;
                auVar28._0_4_ = auVar32._4_4_;
                auVar28._8_4_ = auVar32._12_4_;
                auVar28._12_4_ = auVar32._12_4_;
                fVar27 = (float)(auVar32._0_4_ * 10);
                uStack_228 = (undefined4)((auVar32._8_8_ & 0xffffffff) * 10);
                uStack_224 = (undefined4)((auVar28._8_8_ & 0xffffffff) * 10);
                local_238.m_data[0] = fVar27;
                local_238.m_data[1] = (float)(auVar32._4_4_ * 10);
                uVar16 = 0;
                bVar11 = false;
                do {
                  uVar22 = *(uint *)(local_2e8 + uVar16 * 4) & 0x7fffffff;
                  uVar25 = *(uint *)(local_278 + uVar16 * 4) & 0x7fffffff;
                  iVar19 = uVar22 - uVar25;
                  if (uVar22 < uVar25) {
                    iVar19 = -(uVar22 - uVar25);
                  }
                  if (((int)local_238.m_data[uVar16] < iVar19) && (local_2f4.m_data[uVar16] == true)
                     ) {
                    local_48.m_data[0] = fVar27;
                    local_48.m_data[1] = fVar27;
                    local_48.m_data[2] = fVar27;
                    local_48.m_data[3] = fVar27;
                    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1c8[0]._M_local_buf,"Ref:",4);
                    poVar17 = tcu::operator<<((ostream *)local_1c8[0]._M_local_buf,
                                              (Vector<float,_4> *)local_278);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17," Mask:",6);
                    poVar17 = tcu::operator<<(poVar17,&local_2f4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                    poVar17 = tcu::operator<<(poVar17,&local_48);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17," Color:",7);
                    tcu::operator<<(poVar17,(Vector<float,_4> *)local_2e8);
                    std::__cxx11::stringbuf::str();
                    this = (ImageClearingTestInstance *)local_2e8._24_8_;
                    std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_298);
                    if (local_298[0] != local_288) {
                      operator_delete(local_298[0],local_288[0] + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
                    std::ios_base::~ios_base(local_2c8);
                    if (!bVar11) goto LAB_0047f3e9;
                    break;
                  }
                  bVar11 = 2 < uVar16;
                  uVar16 = uVar16 + 1;
                  this = (ImageClearingTestInstance *)local_2e8._24_8_;
                } while (uVar16 != 4);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != (uint)local_1f8);
            local_2f8 = local_2f8 + 1;
          } while (local_2f8 != (uint)local_210);
          local_2f0 = local_2f0 + 1;
        } while (local_2f0 != local_214);
        uVar23 = local_218 + 1;
      } while (uVar23 < this->m_imageMipLevels);
      bVar11 = true;
      successMessage = local_2a0;
    }
LAB_0047f46d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,
                      CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                               local_2c0.field_2._M_local_buf[0]) + 1);
    }
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::reset(&local_1e8);
    if (!bVar11) {
      return extraout_RAX_01;
    }
  }
  local_260->m_code = QP_TEST_RESULT_PASS;
  (local_260->m_description)._M_dataplus._M_p = (pointer)&(local_260->m_description).field_2;
  pcVar8 = (successMessage->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260->m_description,pcVar8,pcVar8 + successMessage->_M_string_length);
  return extraout_RAX_02;
}

Assistant:

tcu::TestStatus ImageClearingTestInstance::verifyResultImage (const std::string& successMessage, const UVec4& clearCoords) const
{
	const bool useClearRange = clearCoords != UVec4();
	DE_ASSERT(!useClearRange || m_params.imageExtent.depth == 1u);

	if (getIsDepthFormat(m_params.imageFormat))
	{
		DE_ASSERT(m_imageMipLevels == 1u);

		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_DEPTH_BIT);
		std::string							message;
		float								depthValue;

		for (deUint32 y = 0; y < m_params.imageExtent.height; ++y)
		for (deUint32 x = 0; x < m_params.imageExtent.width; ++x)
		{
			if (!useClearRange || isInClearRange(clearCoords, x, y))
				depthValue = m_params.clearValue[0].depthStencil.depth;
			else
				depthValue = m_params.initValue.depthStencil.depth;

			if (!comparePixelToDepthClearValue(image->getLevel(0), x, y, depthValue, message))
				return TestStatus::fail("Depth value mismatch! " + message);
		}
	}

	if (getIsStencilFormat(m_params.imageFormat))
	{
		DE_ASSERT(m_imageMipLevels == 1u);

		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_STENCIL_BIT);
		std::string							message;
		deUint32							stencilValue;

		for (deUint32 y = 0; y < m_params.imageExtent.height; ++y)
		for (deUint32 x = 0; x < m_params.imageExtent.width; ++x)
		{
			if (!useClearRange || isInClearRange(clearCoords, x, y))
				stencilValue = m_params.clearValue[0].depthStencil.stencil;
			else
				stencilValue = m_params.initValue.depthStencil.stencil;

			if (!comparePixelToStencilClearValue(image->getLevel(0), x, y, stencilValue, message))
				return TestStatus::fail("Stencil value mismatch! " + message);
		}
	}

	if (!isDepthStencilFormat(m_params.imageFormat))
	{
		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_COLOR_BIT);
		std::string							message;
		const VkClearColorValue*			pColorValue;

		for (deUint32 mipLevel = 0; mipLevel < m_imageMipLevels; ++mipLevel)
		{
			const int			clearColorNdx	= (mipLevel < m_thresholdMipLevel ? 0 : 1);
			const VkExtent3D	extent			= getMipLevelExtent(m_params.imageExtent, mipLevel);

			for (deUint32 z = 0; z < extent.depth;  ++z)
			for (deUint32 y = 0; y < extent.height; ++y)
			for (deUint32 x = 0; x < extent.width;  ++x)
			{
				if (!useClearRange || isInClearRange(clearCoords, x, y))
					pColorValue = &m_params.clearValue[clearColorNdx].color;
				else
					pColorValue = &m_params.initValue.color;

				if (!comparePixelToColorClearValue(image->getLevel(mipLevel), x, y, z, *pColorValue, message))
					return TestStatus::fail("Color value mismatch! " + message);
			}
		}
	}

	return TestStatus::pass(successMessage);
}